

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeColSingletonPS::execute
          (FreeColSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  pointer pnVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int32_t iVar10;
  bool bVar11;
  int iVar12;
  cpp_dec_float<50U,_int,_void> *pcVar13;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar14;
  long lVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  cpp_dec_float<50U,_int,_void> local_248;
  cpp_dec_float<50U,_int,_void> local_208;
  cpp_dec_float<50U,_int,_void> local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_188;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_180;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_178;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_170;
  cpp_dec_float<50U,_int,_void> local_168;
  uint local_128 [2];
  uint auStack_120 [2];
  uint local_118 [2];
  uint auStack_110 [2];
  uint local_108 [4];
  fpclass_type local_f8;
  int32_t iStack_f4;
  undefined8 uStack_f0;
  cpp_dec_float<50U,_int,_void> local_e0;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar12 = this->m_i;
  iVar4 = this->m_old_i;
  if (iVar12 != iVar4) {
    pnVar5 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 8);
    uVar7 = *(undefined8 *)&pnVar5[iVar12].m_backend.data;
    uVar8 = *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
    uVar9 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar9;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 2) = uVar8;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar12].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar12].m_backend.neg;
    iVar10 = pnVar5[iVar12].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar12].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar10;
    iVar12 = this->m_i;
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = this->m_old_i;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 8);
    uVar7 = *(undefined8 *)&pnVar5[iVar12].m_backend.data;
    uVar8 = *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
    uVar9 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar9;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 2) = uVar8;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar12].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar12].m_backend.neg;
    iVar10 = pnVar5[iVar12].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar12].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar10;
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  iVar12 = this->m_j;
  iVar4 = this->m_old_j;
  if (iVar12 != iVar4) {
    pnVar5 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 8);
    uVar7 = *(undefined8 *)&pnVar5[iVar12].m_backend.data;
    uVar8 = *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
    uVar9 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar9;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 2) = uVar8;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar12].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar12].m_backend.neg;
    iVar10 = pnVar5[iVar12].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar12].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar10;
    iVar12 = this->m_j;
    pnVar5 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = this->m_old_j;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 8);
    uVar8 = *(undefined8 *)&pnVar5[iVar12].m_backend.data;
    uVar9 = *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
    uVar7 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar7;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar8;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 2) = uVar9;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar12].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar12].m_backend.neg;
    iVar10 = pnVar5[iVar12].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar12].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar10;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  local_168.fpclass = cpp_dec_float_finite;
  local_168.prec_elem = 10;
  local_168.data._M_elems[0] = 0;
  local_168.data._M_elems[1] = 0;
  local_168.data._M_elems[2] = 0;
  local_168.data._M_elems[3] = 0;
  local_168.data._M_elems[4] = 0;
  local_168.data._M_elems[5] = 0;
  local_168.data._M_elems._24_5_ = 0;
  local_168.data._M_elems[7]._1_3_ = 0;
  local_168.data._M_elems._32_5_ = 0;
  local_168.data._M_elems[9]._1_3_ = 0;
  local_168.exp = 0;
  local_168.neg = false;
  local_188 = s;
  local_180 = y;
  local_178 = r;
  local_170 = cStatus;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_168,0.0);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_68,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_j);
  iVar12 = (this->m_row).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused;
  if (0 < iVar12) {
    lVar14 = 0;
    lVar15 = 0;
    do {
      pNVar6 = (this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      iVar4 = *(int *)((long)(&pNVar6->val + 1) + lVar14);
      if (iVar4 != this->m_j) {
        pcVar1 = (cpp_dec_float<50U,_int,_void> *)
                 ((long)(pNVar6->val).m_backend.data._M_elems + lVar14);
        pcVar13 = &(x->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar4].m_backend;
        local_248.fpclass = cpp_dec_float_finite;
        local_248.prec_elem = 10;
        local_248.data._M_elems[0] = 0;
        local_248.data._M_elems[1] = 0;
        local_248.data._M_elems[2] = 0;
        local_248.data._M_elems[3] = 0;
        local_248.data._M_elems[4] = 0;
        local_248.data._M_elems[5] = 0;
        local_248.data._M_elems._24_5_ = 0;
        local_248.data._M_elems[7]._1_3_ = 0;
        local_248.data._M_elems._32_5_ = 0;
        local_248.data._M_elems[9]._1_3_ = 0;
        local_248.exp = 0;
        local_248.neg = false;
        v = pcVar1;
        if ((&local_248 != pcVar13) && (v = pcVar13, pcVar1 != &local_248)) {
          uVar7 = *(undefined8 *)((pcVar1->data)._M_elems + 8);
          local_248.data._M_elems._32_5_ = SUB85(uVar7,0);
          local_248.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
          local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
          local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
          uVar7 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
          local_248.data._M_elems._24_5_ = SUB85(uVar7,0);
          local_248.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          local_248.exp = *(int *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar14);
          local_248.neg = *(bool *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar14 + 4);
          local_248._48_8_ = *(undefined8 *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar14 + 8)
          ;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_248,v);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&local_168,&local_248);
        iVar12 = (this->m_row).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
      }
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0x3c;
    } while (lVar15 < iVar12);
  }
  uVar7 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 8);
  local_248.data._M_elems._32_5_ = SUB85(uVar7,0);
  local_248.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  local_248.data._M_elems._0_8_ = *(undefined8 *)(this->m_lRhs).m_backend.data._M_elems;
  local_248.data._M_elems._8_8_ = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 2);
  local_248.data._M_elems._16_8_ = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 4);
  uVar7 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 6);
  local_248.data._M_elems._24_5_ = SUB85(uVar7,0);
  local_248.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  local_248.exp = (this->m_lRhs).m_backend.exp;
  local_248.neg = (this->m_lRhs).m_backend.neg;
  local_248.fpclass = (this->m_lRhs).m_backend.fpclass;
  local_248.prec_elem = (this->m_lRhs).m_backend.prec_elem;
  if ((local_248.neg == true) &&
     (local_248.data._M_elems[0] != 0 || local_248.fpclass != cpp_dec_float_finite)) {
    local_248.neg = false;
  }
  uVar8._5_3_ = local_168.data._M_elems[9]._1_3_;
  uVar8._0_5_ = local_168.data._M_elems._32_5_;
  local_208.data._M_elems[8] = local_168.data._M_elems[8];
  local_208.data._M_elems[9] = SUB84(uVar8,4);
  uVar7._5_3_ = local_168.data._M_elems[7]._1_3_;
  uVar7._0_5_ = local_168.data._M_elems._24_5_;
  local_208.data._M_elems[4] = local_168.data._M_elems[4];
  local_208.data._M_elems[5] = local_168.data._M_elems[5];
  local_208.data._M_elems[6] = local_168.data._M_elems[6];
  local_208.data._M_elems[7] = SUB84(uVar7,4);
  local_208.data._M_elems[0] = local_168.data._M_elems[0];
  local_208.data._M_elems[1] = local_168.data._M_elems[1];
  uVar7 = local_208.data._M_elems._0_8_;
  local_208.data._M_elems[2] = local_168.data._M_elems[2];
  local_208.data._M_elems[3] = local_168.data._M_elems[3];
  local_208.exp = local_168.exp;
  local_208.neg = local_168.neg;
  local_208.fpclass = local_168.fpclass;
  local_208.prec_elem = local_168.prec_elem;
  local_1c8.fpclass = local_168.fpclass;
  if ((local_168.neg != false) &&
     (local_208.data._M_elems[0] = local_168.data._M_elems[0],
     local_1c8.fpclass != cpp_dec_float_finite || local_208.data._M_elems[0] != 0)) {
    local_208.neg = (bool)(local_168.neg ^ 1);
  }
  local_208.data._M_elems._0_8_ = uVar7;
  if (local_1c8.fpclass != cpp_dec_float_NaN && local_248.fpclass != cpp_dec_float_NaN) {
    iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_248,&local_208);
    if (0 < iVar12) {
      pcVar1 = &local_248;
      local_1c8.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
      local_1c8.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
      local_1c8.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
      local_1c8.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
      local_1c8.data._M_elems[4] = local_248.data._M_elems[4];
      local_1c8.data._M_elems[5] = local_248.data._M_elems[5];
      local_1c8.data._M_elems[0] = local_248.data._M_elems[0];
      local_1c8.data._M_elems[1] = local_248.data._M_elems[1];
      local_1c8.data._M_elems[2] = local_248.data._M_elems[2];
      local_1c8.data._M_elems[3] = local_248.data._M_elems[3];
      local_1c8.exp = local_248.exp;
      local_1c8.neg = local_248.neg;
      local_1c8.fpclass = local_248.fpclass;
      goto LAB_0032db33;
    }
    local_1c8.fpclass = local_208.fpclass;
  }
  pcVar1 = &local_208;
  local_1c8.data._M_elems[8] = local_208.data._M_elems[8];
  local_1c8.data._M_elems[9] = local_208.data._M_elems[9];
  local_1c8.data._M_elems[4] = local_208.data._M_elems[4];
  local_1c8.data._M_elems[5] = local_208.data._M_elems[5];
  local_1c8.data._M_elems[6] = local_208.data._M_elems[6];
  local_1c8.data._M_elems[7] = local_208.data._M_elems[7];
  local_1c8.data._M_elems[0] = local_208.data._M_elems[0];
  local_1c8.data._M_elems[1] = local_208.data._M_elems[1];
  local_1c8.data._M_elems[2] = local_208.data._M_elems[2];
  local_1c8.data._M_elems[3] = local_208.data._M_elems[3];
  local_1c8.exp = local_208.exp;
  local_1c8.neg = local_208.neg;
LAB_0032db33:
  local_1c8.prec_elem = pcVar1->prec_elem;
  if (local_1c8.fpclass != cpp_dec_float_NaN) {
    local_248.fpclass = cpp_dec_float_finite;
    local_248.prec_elem = 10;
    local_248.data._M_elems[0] = 0;
    local_248.data._M_elems[1] = 0;
    local_248.data._M_elems[2] = 0;
    local_248.data._M_elems[3] = 0;
    local_248.data._M_elems[4] = 0;
    local_248.data._M_elems[5] = 0;
    local_248.data._M_elems._24_5_ = 0;
    local_248.data._M_elems[7]._1_3_ = 0;
    local_248.data._M_elems._32_5_ = 0;
    local_248.data._M_elems[9]._1_3_ = 0;
    local_248.exp = 0;
    local_248.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_248,1.0);
    iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_1c8,&local_248);
    if (iVar12 < 0) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1c8,1.0);
    }
  }
  local_248.fpclass = cpp_dec_float_finite;
  local_248.prec_elem = 10;
  local_248.data._M_elems[0] = 0;
  local_248.data._M_elems[1] = 0;
  local_248.data._M_elems[2] = 0;
  local_248.data._M_elems[3] = 0;
  local_248.data._M_elems[4] = 0;
  local_248.data._M_elems[5] = 0;
  local_248.data._M_elems._24_5_ = 0;
  local_248.data._M_elems[7]._1_3_ = 0;
  local_248.data._M_elems._32_5_ = 0;
  local_248.data._M_elems[9]._1_3_ = 0;
  local_248.exp = 0;
  local_248.neg = false;
  local_190 = &this->m_lRhs;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_248,&(this->m_lRhs).m_backend,&local_1c8);
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems._24_5_ = 0;
  local_a8.data._M_elems[7]._1_3_ = 0;
  local_a8.data._M_elems._32_5_ = 0;
  local_a8.data._M_elems[9]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_a8,&local_168,&local_1c8);
  local_208.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
  local_208.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
  local_208.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
  local_208.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
  local_208.data._M_elems[4] = local_248.data._M_elems[4];
  local_208.data._M_elems[5] = local_248.data._M_elems[5];
  local_208.data._M_elems[0] = local_248.data._M_elems[0];
  local_208.data._M_elems[1] = local_248.data._M_elems[1];
  local_208.data._M_elems[2] = local_248.data._M_elems[2];
  local_208.data._M_elems[3] = local_248.data._M_elems[3];
  local_208.exp = local_248.exp;
  local_208.neg = local_248.neg;
  local_208.fpclass = local_248.fpclass;
  local_208.prec_elem = local_248.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_208,&local_a8);
  uVar8 = local_208._48_8_;
  bVar11 = local_208.neg;
  iVar12 = local_208.exp;
  local_128[0] = local_208.data._M_elems[0];
  local_128[1] = local_208.data._M_elems[1];
  auStack_120[0] = local_208.data._M_elems[2];
  auStack_120[1] = local_208.data._M_elems[3];
  local_118[0] = local_208.data._M_elems[4];
  local_118[1] = local_208.data._M_elems[5];
  auStack_110[0] = local_208.data._M_elems[6];
  auStack_110[1] = local_208.data._M_elems[7];
  local_108[0] = local_208.data._M_elems[8];
  local_108[1] = local_208.data._M_elems[9];
  local_f8 = local_208.fpclass;
  iStack_f4 = local_208.prec_elem;
  uStack_f0 = 0;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_e0,this);
  uVar9 = local_208._48_8_;
  local_248.data._M_elems._32_5_ = SUB85(local_108._0_8_,0);
  local_248.data._M_elems[9]._1_3_ = SUB83(local_108._0_8_,5);
  local_248.data._M_elems[4] = local_118[0];
  local_248.data._M_elems[5] = local_118[1];
  local_248.data._M_elems._24_5_ = auStack_110._0_5_;
  local_248.data._M_elems[7]._1_3_ = auStack_110[1]._1_3_;
  local_248.data._M_elems[0] = local_128[0];
  local_248.data._M_elems[1] = local_128[1];
  uVar7 = local_248.data._M_elems._0_8_;
  local_248.data._M_elems[2] = auStack_120[0];
  local_248.data._M_elems[3] = auStack_120[1];
  local_248.exp = iVar12;
  local_248.neg = bVar11;
  local_208.fpclass = (fpclass_type)uVar8;
  local_208.prec_elem = SUB84(uVar8,4);
  local_248.fpclass = local_208.fpclass;
  local_248.prec_elem = local_208.prec_elem;
  if ((bVar11 == true) &&
     (local_248.data._M_elems[0] = local_128[0],
     local_248.data._M_elems[0] != 0 || local_f8 != cpp_dec_float_finite)) {
    local_248.neg = false;
  }
  local_248.data._M_elems._0_8_ = uVar7;
  local_208._48_8_ = uVar9;
  if (((local_f8 != cpp_dec_float_NaN) && (local_e0.fpclass != cpp_dec_float_NaN)) &&
     (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_248,&local_e0), iVar12 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_208,0.0);
  }
  local_a8.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
  local_a8.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
  local_a8.data._M_elems[4] = local_208.data._M_elems[4];
  local_a8.data._M_elems[5] = local_208.data._M_elems[5];
  local_a8.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
  local_a8.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
  local_a8.data._M_elems[0] = local_208.data._M_elems[0];
  local_a8.data._M_elems[1] = local_208.data._M_elems[1];
  local_a8.data._M_elems[2] = local_208.data._M_elems[2];
  local_a8.data._M_elems[3] = local_208.data._M_elems[3];
  local_a8.exp = local_208.exp;
  local_a8.neg = local_208.neg;
  local_a8.fpclass = local_208.fpclass;
  local_a8.prec_elem = local_208.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_a8,&local_1c8);
  local_248.fpclass = cpp_dec_float_finite;
  local_248.prec_elem = 10;
  local_248.data._M_elems[0] = 0;
  local_248.data._M_elems[1] = 0;
  local_248.data._M_elems[2] = 0;
  local_248.data._M_elems[3] = 0;
  local_248.data._M_elems[4] = 0;
  local_248.data._M_elems[5] = 0;
  local_248.data._M_elems._24_5_ = 0;
  local_248.data._M_elems[7]._1_3_ = 0;
  local_248.data._M_elems._32_5_ = 0;
  local_248.data._M_elems[9]._1_3_ = 0;
  local_248.exp = 0;
  local_248.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_248,&local_a8,&local_68);
  iVar12 = this->m_j;
  pnVar5 = (x->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar5[iVar12].m_backend.data._M_elems + 8) =
       CONCAT35(local_248.data._M_elems[9]._1_3_,local_248.data._M_elems._32_5_);
  puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = local_248.data._M_elems._16_8_;
  *(ulong *)(puVar2 + 2) = CONCAT35(local_248.data._M_elems[7]._1_3_,local_248.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar5[iVar12].m_backend.data = local_248.data._M_elems._0_8_;
  *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2) = local_248.data._M_elems._8_8_;
  pnVar5[iVar12].m_backend.exp = local_248.exp;
  pnVar5[iVar12].m_backend.neg = local_248.neg;
  pnVar5[iVar12].m_backend.fpclass = local_248.fpclass;
  pnVar5[iVar12].m_backend.prec_elem = local_248.prec_elem;
  iVar12 = this->m_i;
  pnVar5 = (local_188->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 8) =
       *(undefined8 *)((local_190->m_backend).data._M_elems + 8);
  uVar7 = *(undefined8 *)(local_190->m_backend).data._M_elems;
  uVar8 = *(undefined8 *)((local_190->m_backend).data._M_elems + 2);
  uVar9 = *(undefined8 *)((local_190->m_backend).data._M_elems + 6);
  puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = *(undefined8 *)((local_190->m_backend).data._M_elems + 4);
  *(undefined8 *)(puVar2 + 2) = uVar9;
  *(undefined8 *)&pnVar5[iVar12].m_backend.data = uVar7;
  *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2) = uVar8;
  pnVar5[iVar12].m_backend.exp = (this->m_lRhs).m_backend.exp;
  pnVar5[iVar12].m_backend.neg = (this->m_lRhs).m_backend.neg;
  iVar10 = (this->m_lRhs).m_backend.prec_elem;
  pnVar5[iVar12].m_backend.fpclass = (this->m_lRhs).m_backend.fpclass;
  pnVar5[iVar12].m_backend.prec_elem = iVar10;
  local_248.fpclass = cpp_dec_float_finite;
  local_248.prec_elem = 10;
  local_248.data._M_elems[0] = 0;
  local_248.data._M_elems[1] = 0;
  local_248.data._M_elems[2] = 0;
  local_248.data._M_elems[3] = 0;
  local_248.data._M_elems[4] = 0;
  local_248.data._M_elems[5] = 0;
  local_248.data._M_elems._24_5_ = 0;
  local_248.data._M_elems[7]._1_3_ = 0;
  local_248.data._M_elems._32_5_ = 0;
  local_248.data._M_elems[9]._1_3_ = 0;
  local_248.exp = 0;
  local_248.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_248,&(this->m_obj).m_backend,&local_68);
  iVar12 = this->m_i;
  pnVar5 = (local_180->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar5[iVar12].m_backend.data._M_elems + 8) =
       CONCAT35(local_248.data._M_elems[9]._1_3_,local_248.data._M_elems._32_5_);
  puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = local_248.data._M_elems._16_8_;
  *(ulong *)(puVar2 + 2) = CONCAT35(local_248.data._M_elems[7]._1_3_,local_248.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar5[iVar12].m_backend.data = local_248.data._M_elems._0_8_;
  *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2) = local_248.data._M_elems._8_8_;
  pnVar5[iVar12].m_backend.exp = local_248.exp;
  pnVar5[iVar12].m_backend.neg = local_248.neg;
  pnVar5[iVar12].m_backend.fpclass = local_248.fpclass;
  pnVar5[iVar12].m_backend.prec_elem = local_248.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             ((local_178->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  local_170->data[this->m_j] = BASIC;
  if (this->m_eqCons == true) {
    rStatus->data[this->m_i] = FIXED;
  }
  else if (this->m_onLhs == true) {
    rStatus->data[this->m_i] = ON_LOWER;
  }
  else {
    rStatus->data[this->m_i] = ON_UPPER;
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];

   for(int k = 0; k < m_row.size(); ++k)
   {
      if(m_row.index(k) != m_j)
         val += m_row.value(k) * x[m_row.index(k)];
   }

   R scale = maxAbs(m_lRhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_lRhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_lRhs;

   // dual:
   y[m_i] = m_obj / aij;
   r[m_j] = 0.0;

   // basis:
   cStatus[m_j] = SPxSolverBase<R>::BASIC;

   if(m_eqCons)
      rStatus[m_i] = SPxSolverBase<R>::FIXED;
   else if(m_onLhs)
      rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
   else
      rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}